

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O2

vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
* __thiscall
gss::innards::HomomorphismSearcher::solution_in_proof_form_abi_cxx11_
          (vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *__return_storage_ptr__,HomomorphismSearcher *this,HomomorphismAssignments *assignments)

{
  uint uVar1;
  pointer pHVar2;
  pointer ppVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  pointer ppVar7;
  pointer pHVar8;
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pHVar8 = (assignments->values).
           super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pHVar2 = (assignments->values).
           super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pHVar8 == pHVar2) {
      return __return_storage_ptr__;
    }
    ppVar3 = (__return_storage_ptr__->
             super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    ppVar7 = (__return_storage_ptr__->
             super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)ppVar3 - (long)ppVar7;
    for (lVar4 = lVar5 / 0x50 >> 2; 0 < lVar4; lVar4 = lVar4 + -1) {
      uVar6 = (ppVar7->first).first;
      uVar1 = (pHVar8->assignment).pattern_vertex;
      if (uVar6 == uVar1) goto LAB_0012a6ec;
      uVar6 = uVar1;
      if (ppVar7[1].first.first == uVar1) {
        ppVar7 = ppVar7 + 1;
        goto LAB_0012a6ec;
      }
      if (ppVar7[2].first.first == uVar1) {
        ppVar7 = ppVar7 + 2;
        goto LAB_0012a6ec;
      }
      if (ppVar7[3].first.first == uVar1) {
        ppVar7 = ppVar7 + 3;
        goto LAB_0012a6ec;
      }
      ppVar7 = ppVar7 + 4;
      lVar5 = lVar5 + -0x140;
    }
    lVar5 = lVar5 / 0x50;
    if (lVar5 == 1) {
      uVar6 = (pHVar8->assignment).pattern_vertex;
LAB_0012a6e6:
      if ((ppVar7->first).first != uVar6) {
        ppVar7 = ppVar3;
      }
LAB_0012a6ec:
      if (ppVar3 == ppVar7) goto LAB_0012a6f1;
    }
    else {
      if (lVar5 == 2) {
        uVar6 = (pHVar8->assignment).pattern_vertex;
LAB_0012a6de:
        if ((ppVar7->first).first != uVar6) {
          ppVar7 = ppVar7 + 1;
          goto LAB_0012a6e6;
        }
        goto LAB_0012a6ec;
      }
      if (lVar5 == 3) {
        uVar6 = (ppVar7->first).first;
        uVar1 = (pHVar8->assignment).pattern_vertex;
        if (uVar6 != uVar1) {
          ppVar7 = ppVar7 + 1;
          uVar6 = uVar1;
          goto LAB_0012a6de;
        }
        goto LAB_0012a6ec;
      }
      uVar6 = (pHVar8->assignment).pattern_vertex;
LAB_0012a6f1:
      HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                ((NamedVertex *)local_80,this->model,uVar6);
      HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                ((NamedVertex *)local_58,this->model,(pHVar8->assignment).target_vertex);
      std::
      vector<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>
      ::emplace_back<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>
                ((vector<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>
                  *)__return_storage_ptr__,
                 (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_80,(NamedVertex *)local_58);
      std::__cxx11::string::~string((string *)(local_58 + 8));
      std::__cxx11::string::~string((string *)(local_80 + 8));
    }
    pHVar8 = pHVar8 + 1;
  } while( true );
}

Assistant:

auto HomomorphismSearcher::solution_in_proof_form(const HomomorphismAssignments & assignments) const -> vector<pair<NamedVertex, NamedVertex>>
{
    vector<pair<NamedVertex, NamedVertex>> solution;
    for (auto & a : assignments.values)
        if (solution.end() == find_if(solution.begin(), solution.end(), [&](const auto & t) { return unsigned(t.first.first) == a.assignment.pattern_vertex; }))
            solution.emplace_back(
                model.pattern_vertex_for_proof(a.assignment.pattern_vertex),
                model.target_vertex_for_proof(a.assignment.target_vertex));
    return solution;
}